

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O2

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryWriter::addBinary
          (BinaryRegistryWriter *this,deUint32 index,ProgramBinary *binary)

{
  ProgramBinary *this_00;
  pointer pBVar1;
  
  this_00 = (ProgramBinary *)operator_new(0x20);
  ProgramBinary::ProgramBinary(this_00,binary);
  pBVar1 = (this->m_binaries).
           super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->m_binaries).
                    super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 4) <= (ulong)index)
  {
    std::
    vector<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
    ::resize(&this->m_binaries,(ulong)(index + 1));
    pBVar1 = (this->m_binaries).
             super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  pBVar1[index].binary = this_00;
  BinaryIndexHash::insert(&this->m_binaryHash,this_00,index);
  return;
}

Assistant:

void BinaryRegistryWriter::addBinary (deUint32 index, const ProgramBinary& binary)
{
	DE_ASSERT(binary.getFormat() == vk::PROGRAM_FORMAT_SPIRV);
	DE_ASSERT(findBinary(binary) == DE_NULL);

	ProgramBinary* const	binaryClone		= new ProgramBinary(binary);

	try
	{
		if (m_binaries.size() < (size_t)index+1)
			m_binaries.resize(index+1);

		DE_ASSERT(!m_binaries[index].binary);
		DE_ASSERT(m_binaries[index].referenceCount == 0);

		m_binaries[index].binary = binaryClone;
		// \note referenceCount is not incremented here
	}
	catch (...)
	{
		delete binaryClone;
		throw;
	}

	m_binaryHash.insert(binaryClone, index);
}